

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O0

void __thiscall helics::PotentialInterfacesManager::initialize(PotentialInterfacesManager *this)

{
  undefined8 *in_RDI;
  anon_class_8_1_8991fb9c *__f;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_30;
  BaseType local_c;
  
  __f = (anon_class_8_1_8991fb9c *)*in_RDI;
  local_c = (BaseType)Federate::getID((Federate *)in_RDI[1]);
  this_00 = &local_30;
  std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
  function<helics::PotentialInterfacesManager::initialize()::__0,void>(this_00,__f);
  (*(code *)__f->this[3].extraCommands.
            super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node)(__f,local_c,this_00,2);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x3e8e23);
  return;
}

Assistant:

void PotentialInterfacesManager::initialize()
{
    corePtr->setQueryCallback(
        fedPtr->getID(),
        [this](std::string_view query) { return generateQueryResponse(query); },
        2);
}